

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O1

void CoreML::Specification::protobuf_BayesianProbitRegressor_2eproto::TableStruct::InitDefaultsImpl
               (void)

{
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O1/mlmodel/format/BayesianProbitRegressor.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  BayesianProbitRegressor_Gaussian::BayesianProbitRegressor_Gaussian
            ((BayesianProbitRegressor_Gaussian *)
             &_BayesianProbitRegressor_Gaussian_default_instance_);
  DAT_00749ed8 = 1;
  BayesianProbitRegressor_FeatureValueWeight::BayesianProbitRegressor_FeatureValueWeight
            ((BayesianProbitRegressor_FeatureValueWeight *)
             &_BayesianProbitRegressor_FeatureValueWeight_default_instance_);
  DAT_00749f00 = 1;
  BayesianProbitRegressor_FeatureWeight::BayesianProbitRegressor_FeatureWeight
            ((BayesianProbitRegressor_FeatureWeight *)
             &_BayesianProbitRegressor_FeatureWeight_default_instance_);
  DAT_00749f38 = 1;
  BayesianProbitRegressor::BayesianProbitRegressor
            ((BayesianProbitRegressor *)&_BayesianProbitRegressor_default_instance_);
  DAT_00749fb8 = 1;
  DAT_00749ef0 = &_BayesianProbitRegressor_Gaussian_default_instance_;
  DAT_00749fa8 = &_BayesianProbitRegressor_Gaussian_default_instance_;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  _BayesianProbitRegressor_Gaussian_default_instance_.DefaultConstruct();
  _BayesianProbitRegressor_FeatureValueWeight_default_instance_.DefaultConstruct();
  _BayesianProbitRegressor_FeatureWeight_default_instance_.DefaultConstruct();
  _BayesianProbitRegressor_default_instance_.DefaultConstruct();
  _BayesianProbitRegressor_FeatureValueWeight_default_instance_.get_mutable()->featureweight_ = const_cast< ::CoreML::Specification::BayesianProbitRegressor_Gaussian*>(
      ::CoreML::Specification::BayesianProbitRegressor_Gaussian::internal_default_instance());
  _BayesianProbitRegressor_default_instance_.get_mutable()->bias_ = const_cast< ::CoreML::Specification::BayesianProbitRegressor_Gaussian*>(
      ::CoreML::Specification::BayesianProbitRegressor_Gaussian::internal_default_instance());
}